

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

bool __thiscall
duckdb::RowGroupCollection::NextParallelScan
          (RowGroupCollection *this,ClientContext *context,ParallelCollectionScanState *state,
          CollectionScanState *scan_state)

{
  bool bVar1;
  __int_type _Var2;
  ClientConfig *pCVar3;
  long in_RCX;
  long lVar4;
  long in_RDX;
  ClientContext *in_RSI;
  lock_guard<std::mutex> l;
  bool need_to_scan;
  lock_guard<std::mutex> l_1;
  RowGroup *row_group;
  RowGroupCollection *collection;
  idx_t max_row;
  idx_t vector_index;
  mutex_type *in_stack_ffffffffffffff38;
  RowGroup *in_stack_ffffffffffffff40;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff48;
  RowGroup *in_stack_ffffffffffffff50;
  RowGroup *in_stack_ffffffffffffff58;
  CollectionScanState *in_stack_ffffffffffffff60;
  RowGroup *in_stack_ffffffffffffff70;
  SegmentTree<duckdb::RowGroup,_true> *in_stack_ffffffffffffff78;
  int local_54;
  unsigned_long local_38;
  
  while( true ) {
    ::std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((*(long *)(in_RDX + 8) == 0) ||
       (_Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48),
       _Var2 == 0)) {
      local_54 = 3;
    }
    else {
      pCVar3 = ClientConfig::GetConfig(in_RSI);
      if ((pCVar3->verify_parallelism & 1U) == 0) {
        _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48);
        ::std::__atomic_base<unsigned_long>::operator+=
                  ((__atomic_base<unsigned_long> *)(in_RDX + 0x28),_Var2);
        in_stack_ffffffffffffff48 = (__atomic_base<unsigned_long> *)**(undefined8 **)(in_RDX + 8);
        _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48);
        local_38 = (long)&in_stack_ffffffffffffff48->_M_i + _Var2;
        in_stack_ffffffffffffff50 =
             (RowGroup *)
             shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff40 =
             SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                       (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        *(RowGroup **)(in_RDX + 8) = in_stack_ffffffffffffff40;
      }
      else {
        in_stack_ffffffffffffff70 = (RowGroup *)**(long **)(in_RDX + 8);
        _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff78 =
             (SegmentTree<duckdb::RowGroup,_true> *)
             MinValue<unsigned_long>(_Var2,*(long *)(in_RDX + 0x10) * 0x800 + 0x800);
        local_38 = (long)&in_stack_ffffffffffffff78->_vptr_SegmentTree +
                   (long)&in_stack_ffffffffffffff70->super_SegmentBase<duckdb::RowGroup>;
        *(long *)(in_RDX + 0x10) = *(long *)(in_RDX + 0x10) + 1;
        lVar4 = *(long *)(in_RDX + 0x10);
        _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff48);
        if (_Var2 <= (ulong)(lVar4 << 0xb)) {
          in_stack_ffffffffffffff60 =
               (CollectionScanState *)
               shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                         ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_ffffffffffffff40
                         );
          in_stack_ffffffffffffff58 =
               SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          *(RowGroup **)(in_RDX + 8) = in_stack_ffffffffffffff58;
          *(undefined8 *)(in_RDX + 0x10) = 0;
        }
      }
      in_stack_ffffffffffffff38 =
           (mutex_type *)MinValue<unsigned_long>(local_38,*(unsigned_long *)(in_RDX + 0x18));
      lVar4 = *(long *)(in_RDX + 0x20) + 1;
      *(long *)(in_RDX + 0x20) = lVar4;
      *(long *)(in_RCX + 0x30) = lVar4;
      local_54 = 0;
    }
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xbae531);
    if (local_54 != 0) break;
    bVar1 = InitializeScanInRowGroup
                      (in_stack_ffffffffffffff60,(RowGroupCollection *)in_stack_ffffffffffffff58,
                       in_stack_ffffffffffffff50,(idx_t)in_stack_ffffffffffffff48,
                       (idx_t)in_stack_ffffffffffffff40);
    if (bVar1) {
      return true;
    }
  }
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  *(undefined8 *)(in_RCX + 0x30) = *(undefined8 *)(in_RDX + 0x20);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0xbae5ce);
  return false;
}

Assistant:

bool RowGroupCollection::NextParallelScan(ClientContext &context, ParallelCollectionScanState &state,
                                          CollectionScanState &scan_state) {
	while (true) {
		idx_t vector_index;
		idx_t max_row;
		RowGroupCollection *collection;
		RowGroup *row_group;
		{
			// select the next row group to scan from the parallel state
			lock_guard<mutex> l(state.lock);
			if (!state.current_row_group || state.current_row_group->count == 0) {
				// no more data left to scan
				break;
			}
			collection = state.collection;
			row_group = state.current_row_group;
			if (ClientConfig::GetConfig(context).verify_parallelism) {
				vector_index = state.vector_index;
				max_row = state.current_row_group->start +
				          MinValue<idx_t>(state.current_row_group->count,
				                          STANDARD_VECTOR_SIZE * state.vector_index + STANDARD_VECTOR_SIZE);
				D_ASSERT(vector_index * STANDARD_VECTOR_SIZE < state.current_row_group->count);
				state.vector_index++;
				if (state.vector_index * STANDARD_VECTOR_SIZE >= state.current_row_group->count) {
					state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
					state.vector_index = 0;
				}
			} else {
				state.processed_rows += state.current_row_group->count;
				vector_index = 0;
				max_row = state.current_row_group->start + state.current_row_group->count;
				state.current_row_group = row_groups->GetNextSegment(state.current_row_group);
			}
			max_row = MinValue<idx_t>(max_row, state.max_row);
			scan_state.batch_index = ++state.batch_index;
		}
		D_ASSERT(collection);
		D_ASSERT(row_group);

		// initialize the scan for this row group
		bool need_to_scan = InitializeScanInRowGroup(scan_state, *collection, *row_group, vector_index, max_row);
		if (!need_to_scan) {
			// skip this row group
			continue;
		}
		return true;
	}
	lock_guard<mutex> l(state.lock);
	scan_state.batch_index = state.batch_index;
	return false;
}